

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubTransport_AMQP_Common_SetOption(TRANSPORT_LL_HANDLE handle,char *option,void *value)

{
  double dVar1;
  _Bool is_trace_on;
  int iVar2;
  LOGGER_LOG p_Var3;
  long lVar4;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *puVar5;
  IOTHUB_CLIENT_RESULT IVar6;
  XIO_HANDLE xio;
  char *pcVar7;
  char *copied_proxy_username;
  char *copied_proxy_hostname;
  char *copied_proxy_password;
  
  if ((option == (char *)0x0 || handle == (TRANSPORT_LL_HANDLE)0x0) || value == (void *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar7 = 
    "Invalid parameter (NULL) passed to AMQP transport SetOption (handle=%p, options=%p, value=%p)";
    iVar2 = 0x726;
    goto LAB_0012de04;
  }
  iVar2 = strcmp("cbs_request_timeout",option);
  if (iVar2 == 0) {
    lVar4 = 0x80;
  }
  else {
    iVar2 = strcmp("event_send_timeout_secs",option);
    if (iVar2 != 0) {
      iVar2 = strcmp("retry_interval_sec",option);
      if (iVar2 == 0) {
        iVar2 = retry_control_set_option
                          (*(RETRY_CONTROL_HANDLE *)((long)handle + 0x48),
                           "initial_wait_time_in_secs",value);
        if (iVar2 == 0) {
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        IVar6 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar7 = "Failure setting retry interval option";
        iVar2 = 0x74d;
        goto LAB_0012e0fe;
      }
      iVar2 = strcmp("retry_max_delay_secs",option);
      if (iVar2 == 0) {
        iVar2 = retry_control_set_option
                          (*(RETRY_CONTROL_HANDLE *)((long)handle + 0x48),"max_delay_in_secs",value)
        ;
        if (iVar2 == 0) {
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        IVar6 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar7 = "Failure setting retry max delay option";
        iVar2 = 0x759;
        goto LAB_0012e0fe;
      }
      iVar2 = strcmp("svc2cl_keep_alive_timeout_secs",option);
      if ((iVar2 == 0) || (iVar2 = strcmp("c2d_keep_alive_freq_secs",option), iVar2 == 0)) {
        *(undefined8 *)((long)handle + 0x50) = *value;
        return IOTHUB_CLIENT_OK;
      }
      iVar2 = strcmp("cl2svc_keep_alive_send_ratio",option);
      if (iVar2 == 0) {
        dVar1 = *value;
        if ((0.0 < dVar1) && (dVar1 < 0.9)) {
          *(double *)((long)handle + 0x58) = dVar1;
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_INVALID_ARG;
        }
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                  ,"IoTHubTransport_AMQP_Common_SetOption",0x76b,1,"Invalid remote idle ratio %lf",
                  *value);
        return IOTHUB_CLIENT_INVALID_ARG;
      }
      iVar2 = strcmp("logtrace",option);
      if (iVar2 == 0) {
        is_trace_on = *value;
        *(_Bool *)((long)handle + 0x30) = is_trace_on;
        if (*(AMQP_CONNECTION_HANDLE *)((long)handle + 0x18) == (AMQP_CONNECTION_HANDLE)0x0) {
          return IOTHUB_CLIENT_OK;
        }
        iVar2 = amqp_connection_set_logging
                          (*(AMQP_CONNECTION_HANDLE *)((long)handle + 0x18),is_trace_on);
        if (iVar2 == 0) {
          return IOTHUB_CLIENT_OK;
        }
        p_Var3 = xlogging_get_log_function();
        IVar6 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar7 = "transport failed setting option \'%s\' (amqp_connection_set_logging failed)";
        iVar2 = 0x77c;
        goto LAB_0012e0fe;
      }
      iVar2 = strcmp("proxy_data",option);
      if (iVar2 != 0) {
        iVar2 = strcmp("x509certificate",option);
        if ((iVar2 == 0) || (iVar2 = strcmp("x509privatekey",option), iVar2 == 0)) {
          if (*(int *)((long)handle + 0x24) == 2) {
            IoTHubClient_Auth_Set_x509_Type
                      (*(IOTHUB_AUTHORIZATION_HANDLE *)((long)handle + 0x90),true);
          }
          else {
            if (*(int *)((long)handle + 0x24) != 0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 == (LOGGER_LOG)0x0) {
                return IOTHUB_CLIENT_INVALID_ARG;
              }
              pcVar7 = 
              "transport failed setting option \'%s\' (preferred authentication method is not x509)"
              ;
              iVar2 = 0x7cc;
              goto LAB_0012de04;
            }
            *(undefined4 *)((long)handle + 0x24) = 2;
          }
        }
        xio = *(XIO_HANDLE *)((long)handle + 8);
        if (xio == (XIO_HANDLE)0x0) {
          iVar2 = get_new_underlying_io_transport
                            ((AMQP_TRANSPORT_INSTANCE *)handle,(XIO_HANDLE *)((long)handle + 8));
          if (iVar2 != 0) {
            p_Var3 = xlogging_get_log_function();
            IVar6 = IOTHUB_CLIENT_ERROR;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return IOTHUB_CLIENT_ERROR;
            }
            pcVar7 = 
            "transport failed setting option \'%s\' (failed to obtain a TLS I/O transport).";
            iVar2 = 0x7da;
            goto LAB_0012e0fe;
          }
          xio = *(XIO_HANDLE *)((long)handle + 8);
        }
        iVar2 = xio_setoption(xio,option,value);
        if (iVar2 == 0) {
          iVar2 = save_underlying_io_transport_options((AMQP_TRANSPORT_INSTANCE *)handle);
          if (iVar2 == 0) {
            return IOTHUB_CLIENT_OK;
          }
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return IOTHUB_CLIENT_OK;
          }
          pcVar7 = 
          "IoTHubTransport_AMQP_Common_SetOption failed to save underlying I/O options; failure will be ignored"
          ;
          IVar6 = IOTHUB_CLIENT_OK;
          iVar2 = 0x7e6;
        }
        else {
          p_Var3 = xlogging_get_log_function();
          IVar6 = IOTHUB_CLIENT_ERROR;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return IOTHUB_CLIENT_ERROR;
          }
          pcVar7 = "transport failed setting option \'%s\' (xio_setoption failed)";
          iVar2 = 0x7df;
        }
        goto LAB_0012e0fe;
      }
      if (*(long *)((long)handle + 8) != 0) {
        p_Var3 = xlogging_get_log_function();
        IVar6 = IOTHUB_CLIENT_ERROR;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar7 = "Cannot set proxy option once the underlying IO is created";
        iVar2 = 0x78a;
        goto LAB_0012e0fe;
      }
      pcVar7 = *value;
      if (pcVar7 == (char *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_INVALID_ARG;
        }
        pcVar7 = "NULL host_address in proxy options";
        iVar2 = 0x78f;
LAB_0012de04:
        IVar6 = IOTHUB_CLIENT_INVALID_ARG;
      }
      else {
        if (*(long *)((long)value + 0x10) == 0) {
          if (*(long *)((long)value + 0x18) != 0) goto LAB_0012e474;
        }
        else if (*(long *)((long)value + 0x18) == 0) {
LAB_0012e474:
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return IOTHUB_CLIENT_INVALID_ARG;
          }
          pcVar7 = "Only one of username and password for proxy settings was NULL";
          iVar2 = 0x795;
          goto LAB_0012de04;
        }
        copied_proxy_hostname = (char *)0x0;
        copied_proxy_username = (char *)0x0;
        copied_proxy_password = (char *)0x0;
        *(undefined4 *)((long)handle + 0x68) = *(undefined4 *)((long)value + 8);
        iVar2 = mallocAndStrcpy_s(&copied_proxy_hostname,pcVar7);
        if (iVar2 == 0) {
          if ((*(char **)((long)value + 0x10) == (char *)0x0) ||
             (iVar2 = mallocAndStrcpy_s(&copied_proxy_username,*(char **)((long)value + 0x10)),
             iVar2 == 0)) {
            if ((*(char **)((long)value + 0x18) == (char *)0x0) ||
               (iVar2 = mallocAndStrcpy_s(&copied_proxy_password,*(char **)((long)value + 0x18)),
               iVar2 == 0)) {
              free_proxy_data((AMQP_TRANSPORT_INSTANCE *)handle);
              *(char **)((long)handle + 0x60) = copied_proxy_hostname;
              *(char **)((long)handle + 0x70) = copied_proxy_username;
              *(char **)((long)handle + 0x78) = copied_proxy_password;
              return IOTHUB_CLIENT_OK;
            }
            free(copied_proxy_username);
            free(copied_proxy_hostname);
            p_Var3 = xlogging_get_log_function();
            IVar6 = IOTHUB_CLIENT_ERROR;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return IOTHUB_CLIENT_ERROR;
            }
            pcVar7 = "Cannot copy HTTP proxy password";
            iVar2 = 0x7b1;
          }
          else {
            free(copied_proxy_hostname);
            p_Var3 = xlogging_get_log_function();
            IVar6 = IOTHUB_CLIENT_ERROR;
            if (p_Var3 == (LOGGER_LOG)0x0) {
              return IOTHUB_CLIENT_ERROR;
            }
            pcVar7 = "Cannot copy HTTP proxy username";
            iVar2 = 0x7a7;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          IVar6 = IOTHUB_CLIENT_ERROR;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            return IOTHUB_CLIENT_ERROR;
          }
          pcVar7 = "Cannot copy HTTP proxy hostname";
          iVar2 = 0x7a1;
        }
      }
      goto LAB_0012e0fe;
    }
    lVar4 = 0x88;
  }
  *(undefined8 *)((long)handle + lVar4) = *value;
  iVar2 = strcmp("cbs_request_timeout",option);
  if (iVar2 == 0) {
    pcVar7 = "cbs_request_timeout_secs";
LAB_0012dfa4:
    item_handle = singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28));
    while( true ) {
      if (item_handle == (LIST_ITEM_HANDLE)0x0) {
        return IOTHUB_CLIENT_OK;
      }
      puVar5 = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
      if (puVar5 == (undefined8 *)0x0) break;
      iVar2 = amqp_device_set_option((AMQP_DEVICE_HANDLE)puVar5[1],pcVar7,value);
      if (iVar2 != 0) {
        STRING_c_str((STRING_HANDLE)*puVar5);
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012e0c6;
        pcVar7 = 
        "failed setting option \'%s\' to registered device \'%s\' (amqp_device_set_option failed)";
        iVar2 = 0x4cb;
        goto LAB_0012e0c1;
      }
      item_handle = singlylinkedlist_get_next_item(item_handle);
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_0012e0c6;
    pcVar7 = 
    "failed setting option \'%s\' to registered device (singlylinkedlist_item_get_value failed)";
    iVar2 = 0x4c3;
LAB_0012e0c1:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
              ,"IoTHubTransport_AMQP_Common_Device_SetOption",iVar2,1,pcVar7,option);
  }
  else {
    pcVar7 = "event_send_timeout_secs";
    iVar2 = strcmp("event_send_timeout_secs",option);
    if (iVar2 == 0) goto LAB_0012dfa4;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar7 = 
      "failed setting option \'%s\' to registered device (could not match name to options supported by device)"
      ;
      iVar2 = 0x4b3;
      goto LAB_0012e0c1;
    }
  }
LAB_0012e0c6:
  p_Var3 = xlogging_get_log_function();
  IVar6 = IOTHUB_CLIENT_ERROR;
  if (p_Var3 == (LOGGER_LOG)0x0) {
    return IOTHUB_CLIENT_ERROR;
  }
  pcVar7 = 
  "transport failed setting option \'%s\' (failed setting option on one or more registered devices)"
  ;
  iVar2 = 0x741;
LAB_0012e0fe:
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
            ,"IoTHubTransport_AMQP_Common_SetOption",iVar2,1,pcVar7);
  return IVar6;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_AMQP_Common_SetOption(TRANSPORT_LL_HANDLE handle, const char* option, const void* value)
{
    IOTHUB_CLIENT_RESULT result;

    if ((handle == NULL) || (option == NULL) || (value == NULL))
    {
        LogError("Invalid parameter (NULL) passed to AMQP transport SetOption (handle=%p, options=%p, value=%p)", handle, option, value);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* transport_instance = (AMQP_TRANSPORT_INSTANCE*)handle;
        bool is_device_specific_option;

        if (strcmp(OPTION_CBS_REQUEST_TIMEOUT, option) == 0)
        {
            is_device_specific_option = true;
            transport_instance->option_cbs_request_timeout_secs = *(size_t*)value;
        }
        else if (strcmp(OPTION_EVENT_SEND_TIMEOUT_SECS, option) == 0)
        {
            is_device_specific_option = true;
            transport_instance->option_send_event_timeout_secs = *(size_t*)value;
        }
        else
        {
            is_device_specific_option = false;
        }

        if (is_device_specific_option)
        {
            if (IoTHubTransport_AMQP_Common_Device_SetOption(handle, option, (void*)value) != RESULT_OK)
            {
                LogError("transport failed setting option '%s' (failed setting option on one or more registered devices)", option);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_RETRY_INTERVAL_SEC, option) == 0)
        {
            if (retry_control_set_option(transport_instance->connection_retry_control, RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, value) != 0)
            {
                LogError("Failure setting retry interval option");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_RETRY_MAX_DELAY_SECS, option) == 0)
        {
            if (retry_control_set_option(transport_instance->connection_retry_control, RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS, value) != 0)
            {
                LogError("Failure setting retry max delay option");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if ((strcmp(OPTION_SERVICE_SIDE_KEEP_ALIVE_FREQ_SECS, option) == 0) || (strcmp(OPTION_C2D_KEEP_ALIVE_FREQ_SECS, option) == 0))
        {
            transport_instance->svc2cl_keep_alive_timeout_secs = *(size_t*)value;
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_REMOTE_IDLE_TIMEOUT_RATIO, option) == 0)
        {

            if ((*(double*)value <= 0.0) || (*(double*)value >= MAX_SERVICE_KEEP_ALIVE_RATIO))
            {
                LogError("Invalid remote idle ratio %lf", *(double*) value);
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                transport_instance->cl2svc_keep_alive_send_ratio = *(double*)value; // override the default and set the user configured remote idle ratio value
                result = IOTHUB_CLIENT_OK;
            }

        }
        else if (strcmp(OPTION_LOG_TRACE, option) == 0)
        {
            transport_instance->is_trace_on = *((bool*)value);

            if (transport_instance->amqp_connection != NULL &&
                amqp_connection_set_logging(transport_instance->amqp_connection, transport_instance->is_trace_on) != RESULT_OK)
            {
                LogError("transport failed setting option '%s' (amqp_connection_set_logging failed)", option);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_HTTP_PROXY, option) == 0)
        {
            HTTP_PROXY_OPTIONS* proxy_options = (HTTP_PROXY_OPTIONS*)value;

            if (transport_instance->tls_io != NULL)
            {
                LogError("Cannot set proxy option once the underlying IO is created");
                result = IOTHUB_CLIENT_ERROR;
            }
            else if (proxy_options->host_address == NULL)
            {
                LogError("NULL host_address in proxy options");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else if (((proxy_options->username == NULL) || (proxy_options->password == NULL)) &&
                (proxy_options->username != proxy_options->password))
            {
                LogError("Only one of username and password for proxy settings was NULL");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* copied_proxy_hostname = NULL;
                char* copied_proxy_username = NULL;
                char* copied_proxy_password = NULL;

                transport_instance->http_proxy_port = proxy_options->port;
                if (mallocAndStrcpy_s(&copied_proxy_hostname, proxy_options->host_address) != 0)
                {
                    LogError("Cannot copy HTTP proxy hostname");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((proxy_options->username != NULL) && (mallocAndStrcpy_s(&copied_proxy_username, proxy_options->username) != 0))
                {
                    free(copied_proxy_hostname);
                    LogError("Cannot copy HTTP proxy username");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((proxy_options->password != NULL) && (mallocAndStrcpy_s(&copied_proxy_password, proxy_options->password) != 0))
                {
                    if (copied_proxy_username != NULL)
                    {
                        free(copied_proxy_username);
                    }
                    free(copied_proxy_hostname);
                    LogError("Cannot copy HTTP proxy password");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    free_proxy_data(transport_instance);

                    transport_instance->http_proxy_hostname = copied_proxy_hostname;
                    transport_instance->http_proxy_username = copied_proxy_username;
                    transport_instance->http_proxy_password = copied_proxy_password;

                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else
        {
            result = IOTHUB_CLIENT_OK;

            if (strcmp(OPTION_X509_CERT, option) == 0 || strcmp(OPTION_X509_PRIVATE_KEY, option) == 0)
            {
                if (transport_instance->preferred_authentication_mode == AMQP_TRANSPORT_AUTHENTICATION_MODE_NOT_SET)
                {
                    transport_instance->preferred_authentication_mode = AMQP_TRANSPORT_AUTHENTICATION_MODE_X509;
                }
                else if (transport_instance->preferred_authentication_mode != AMQP_TRANSPORT_AUTHENTICATION_MODE_X509)
                {
                    LogError("transport failed setting option '%s' (preferred authentication method is not x509)", option);
                    result = IOTHUB_CLIENT_INVALID_ARG;
                }
                else
                {
                    IoTHubClient_Auth_Set_x509_Type(transport_instance->authorization_module, true);
                }
            }

            if (result != IOTHUB_CLIENT_INVALID_ARG)
            {
                if (transport_instance->tls_io == NULL &&
                    get_new_underlying_io_transport(transport_instance, &transport_instance->tls_io) != RESULT_OK)
                {
                    LogError("transport failed setting option '%s' (failed to obtain a TLS I/O transport).", option);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if (xio_setoption(transport_instance->tls_io, option, value) != RESULT_OK)
                {
                    LogError("transport failed setting option '%s' (xio_setoption failed)", option);
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    if (save_underlying_io_transport_options(transport_instance) != RESULT_OK)
                    {
                        LogError("IoTHubTransport_AMQP_Common_SetOption failed to save underlying I/O options; failure will be ignored");
                    }

                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
    }

    return result;
}